

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void set_remove_node(lyxp_set *set,uint32_t idx)

{
  uint32_t idx_local;
  lyxp_set *set_local;
  
  if ((set != (lyxp_set *)0x0) && (set->type == LYXP_SET_NODE_SET)) {
    if (set->used <= idx) {
      __assert_fail("idx < set->used",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                    ,0x46a,"void set_remove_node(struct lyxp_set *, uint32_t)");
    }
    set_remove_node_hash(set,(set->val).nodes[idx].node,(set->val).nodes[idx].type);
    set->used = set->used - 1;
    if (idx < set->used) {
      memmove((set->val).nodes + idx,(set->val).nodes + (idx + 1),(ulong)(set->used - idx) << 4);
    }
    else if (set->used == 0) {
      lyxp_set_free_content(set);
    }
    return;
  }
  __assert_fail("set && (set->type == LYXP_SET_NODE_SET)",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x469,"void set_remove_node(struct lyxp_set *, uint32_t)");
}

Assistant:

static void
set_remove_node(struct lyxp_set *set, uint32_t idx)
{
    assert(set && (set->type == LYXP_SET_NODE_SET));
    assert(idx < set->used);

    set_remove_node_hash(set, set->val.nodes[idx].node, set->val.nodes[idx].type);

    --set->used;
    if (idx < set->used) {
        memmove(&set->val.nodes[idx], &set->val.nodes[idx + 1], (set->used - idx) * sizeof *set->val.nodes);
    } else if (!set->used) {
        lyxp_set_free_content(set);
    }
}